

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorBase<const_slang::ast::BitTrie_*> * __thiscall
slang::SmallVectorBase<const_slang::ast::BitTrie_*>::operator=
          (SmallVectorBase<const_slang::ast::BitTrie_*> *this,
          SmallVectorBase<const_slang::ast::BitTrie_*> *rhs)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  size_t __n;
  pointer __src;
  pointer __dest;
  
  if (this == rhs) {
    return this;
  }
  __src = rhs->data_;
  if (__src != (pointer)rhs->firstElement) {
    if (this->data_ != (pointer)this->firstElement) {
      operator_delete(this->data_);
      __src = rhs->data_;
    }
    rhs->data_ = (pointer)0x0;
    this->data_ = __src;
    sVar4 = rhs->len;
    rhs->len = 0;
    this->len = sVar4;
    sVar4 = rhs->cap;
    rhs->cap = 0;
    this->cap = sVar4;
    return this;
  }
  uVar1 = this->len;
  uVar2 = rhs->len;
  if (uVar1 < uVar2) {
    if (this->cap < uVar2) {
      this->len = 0;
      reserve(this,rhs->len);
    }
    else if (uVar1 != 0) {
      memmove(this->data_,__src,uVar1 << 3);
    }
    sVar3 = this->len;
    sVar4 = rhs->len;
    __n = sVar4 * 8 + sVar3 * -8;
    if (__n == 0) goto LAB_0025981e;
    __src = rhs->data_ + sVar3;
    __dest = this->data_ + sVar3;
  }
  else {
    if (uVar2 == 0) {
      sVar4 = 0;
      goto LAB_0025981e;
    }
    __dest = this->data_;
    __n = uVar2 << 3;
  }
  memmove(__dest,__src,__n);
  sVar4 = rhs->len;
LAB_0025981e:
  this->len = sVar4;
  rhs->len = 0;
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(SmallVectorBase<T>&& rhs) {
    if (this == &rhs)
        return *this;

    // If the rhs isn't small, clear this vector and then steal its buffer.
    if (!rhs.isSmall()) {
        cleanup();
        this->data_ = std::exchange(rhs.data_, nullptr);
        this->len = std::exchange(rhs.len, 0);
        this->cap = std::exchange(rhs.cap, 0);
        return *this;
    }

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::move(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        rhs.clear();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::move(rhs.begin(), rhs.begin() + len, begin());
    }

    // Move construct the new elements in place.
    std::uninitialized_move(rhs.begin() + len, rhs.end(), begin() + len);
    len = rhs.size();
    rhs.clear();
    return *this;
}